

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  LogMessage *other_00;
  RepeatedPtrFieldBase temp;
  RepeatedPtrFieldBase local_78;
  LogMessage local_60;
  
  if (other->arena_ == this->arena_) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ac);
    other_00 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: other->GetArenaNoVirtual() != GetArenaNoVirtual(): ");
    LogFinisher::operator=((LogFinisher *)&local_78,other_00);
    LogMessage::~LogMessage(&local_60);
  }
  local_78.arena_ = other->arena_;
  local_78.current_size_ = 0;
  local_78.total_size_ = 0;
  local_78.rep_ = (Rep *)0x0;
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
            (&local_78,this);
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this);
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this,other);
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(other);
  InternalSwap(other,&local_78);
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(&local_78);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(other->GetArenaNoVirtual() != GetArenaNoVirtual());

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied cross-arena only
  // once, not twice.
  RepeatedPtrFieldBase temp(other->GetArenaNoVirtual());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->Clear<TypeHandler>();
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}